

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O1

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadSkeleton(OgreBinarySerializer *this,Skeleton *skeleton)

{
  Bone *this_00;
  size_type __n;
  bool bVar1;
  unsigned_short uVar2;
  int iVar3;
  uint uVar4;
  Logger *pLVar5;
  runtime_error *prVar6;
  char *pcVar7;
  MemoryStreamReader *this_01;
  long lVar8;
  bool bVar9;
  long lVar10;
  string version;
  string local_1e8;
  string local_1c8 [32];
  undefined1 *local_1a8 [2];
  undefined1 local_198 [360];
  
  uVar2 = StreamReader<false,_false>::Get<unsigned_short>(this->m_reader);
  if (uVar2 != 0x1000) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1a8[0] = local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"Invalid Ogre Skeleton file header.","");
    std::runtime_error::runtime_error(prVar6,(string *)local_1a8);
    *(undefined ***)prVar6 = &PTR__runtime_error_00896c98;
    __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  ReadLine_abi_cxx11_(&local_1e8,this);
  __n = local_1e8._M_string_length;
  if (local_1e8._M_string_length == DAT_009801d8) {
    if (local_1e8._M_string_length == 0) goto LAB_004844a0;
    iVar3 = bcmp(local_1e8._M_dataplus._M_p,SKELETON_VERSION_1_8_abi_cxx11_,
                 local_1e8._M_string_length);
    if (iVar3 == 0) goto LAB_004844a0;
  }
  if (__n == DAT_009801f8) {
    if (__n != 0) {
      iVar3 = bcmp(local_1e8._M_dataplus._M_p,SKELETON_VERSION_1_1_abi_cxx11_,__n);
      if (iVar3 != 0) goto LAB_004845fe;
    }
LAB_004844a0:
    pLVar5 = DefaultLogger::get();
    pcVar7 = "Reading Skeleton";
    Logger::debug(pLVar5,"Reading Skeleton");
    this_01 = this->m_reader;
    if (*(int *)&this_01->end != *(int *)&this_01->current) {
      bVar1 = true;
      bVar9 = true;
      do {
        uVar2 = StreamReader<false,_false>::Get<unsigned_short>(this_01);
        uVar4 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
        this->m_currentLen = uVar4;
        if (uVar2 < 0x3000) {
          if (uVar2 == 0x1010) {
            uVar2 = StreamReader<false,_false>::Get<unsigned_short>(this->m_reader);
            skeleton->blendMode = (uint)uVar2;
          }
          else if (uVar2 == 0x2000) {
            if (bVar9) {
              pLVar5 = DefaultLogger::get();
              Logger::debug(pLVar5,"  - Bones");
              bVar9 = false;
            }
            pcVar7 = (char *)skeleton;
            ReadBone(this,skeleton);
          }
        }
        else if (uVar2 == 0x3000) {
          pcVar7 = (char *)skeleton;
          ReadBoneParent(this,skeleton);
        }
        else if (uVar2 == 0x4000) {
          if (bVar1) {
            pLVar5 = DefaultLogger::get();
            Logger::debug(pLVar5,"  - Animations");
            bVar1 = false;
          }
          pcVar7 = (char *)skeleton;
          ReadSkeletonAnimation(this,skeleton);
        }
        else if (uVar2 == 0x5000) {
          ReadSkeletonAnimationLink(this,(Skeleton *)pcVar7);
        }
        this_01 = this->m_reader;
      } while (*(int *)&this_01->end != *(int *)&this_01->current);
    }
    lVar10 = (long)(skeleton->bones).
                   super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(skeleton->bones).
                   super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    if (lVar10 != 0) {
      lVar10 = lVar10 >> 3;
      lVar8 = 0;
      do {
        this_00 = (skeleton->bones).
                  super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar8];
        bVar1 = Bone::IsParented(this_00);
        if (!bVar1) {
          Bone::CalculateWorldMatrixAndDefaultPose(this_00,skeleton);
        }
        lVar8 = lVar8 + 1;
      } while (lVar10 + (ulong)(lVar10 == 0) != lVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p);
    }
    return;
  }
LAB_004845fe:
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Skeleton version ",0x11);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8," not supported by this importer.",0x20);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8," Supported versions: ",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,SKELETON_VERSION_1_8_abi_cxx11_,DAT_009801d8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," and ",5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,SKELETON_VERSION_1_1_abi_cxx11_,DAT_009801f8);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar6,local_1c8);
  *(undefined ***)prVar6 = &PTR__runtime_error_00896c98;
  __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void OgreBinarySerializer::ReadSkeleton(Skeleton *skeleton)
{
    uint16_t id = ReadHeader(false);
    if (id != HEADER_CHUNK_ID) {
        throw DeadlyExportError("Invalid Ogre Skeleton file header.");
    }

    // This deserialization supports both versions of the skeleton spec
    std::string version = ReadLine();
    if (version != SKELETON_VERSION_1_8 && version != SKELETON_VERSION_1_1)
    {
        throw DeadlyExportError(Formatter::format() << "Skeleton version " << version << " not supported by this importer."
            << " Supported versions: " << SKELETON_VERSION_1_8 << " and " << SKELETON_VERSION_1_1);
    }

    ASSIMP_LOG_DEBUG("Reading Skeleton");

    bool firstBone = true;
    bool firstAnim = true;

    while (!AtEnd())
    {
        id = ReadHeader();
        switch(id)
        {
            case SKELETON_BLENDMODE:
            {
                skeleton->blendMode = static_cast<Skeleton::BlendMode>(Read<uint16_t>());
                break;
            }
            case SKELETON_BONE:
            {
                if (firstBone)
                {
                    ASSIMP_LOG_DEBUG("  - Bones");
                    firstBone = false;
                }

                ReadBone(skeleton);
                break;
            }
            case SKELETON_BONE_PARENT:
            {
                ReadBoneParent(skeleton);
                break;
            }
            case SKELETON_ANIMATION:
            {
                if (firstAnim)
                {
                    ASSIMP_LOG_DEBUG("  - Animations");
                    firstAnim = false;
                }

                ReadSkeletonAnimation(skeleton);
                break;
            }
            case SKELETON_ANIMATION_LINK:
            {
                ReadSkeletonAnimationLink(skeleton);
                break;
            }
        }
    }

    // Calculate bone matrices for root bones. Recursively calculates their children.
    for (size_t i=0, len=skeleton->bones.size(); i<len; ++i)
    {
        Bone *bone = skeleton->bones[i];
        if (!bone->IsParented())
            bone->CalculateWorldMatrixAndDefaultPose(skeleton);
    }
}